

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O3

size_type __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
::size(flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
       *this)

{
  pointer_type pcVar1;
  size_type sVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong *local_10;
  
  buffer_t<char>::validate((buffer_t<char> *)this);
  begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::allocator<_FLAT_FORWARD_LIST_TEST>_>
         *)&stack0xfffffffffffffff0);
  buffer_t<char>::validate((buffer_t<char> *)this);
  pcVar1 = (this->buffer_).v2_.last;
  if (pcVar1 == (pointer_type)0x0) {
    puVar3 = (ulong *)0x0;
  }
  else {
    puVar3 = (ulong *)(pcVar1 + (*(long *)(pcVar1 + 0x10) + 0x1fU & 0xfffffffffffffff8));
  }
  sVar2 = 0;
  for (; local_10 != puVar3; local_10 = (ulong *)((long)local_10 + uVar4)) {
    uVar4 = *local_10;
    if (uVar4 == 0) {
      uVar4 = local_10[2] + 0x1f & 0xfffffffffffffff8;
    }
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_type size() const noexcept {
        validate_pointer_invariants();
        size_type s = 0;
        std::for_each(cbegin(), cend(), [&s](T const &) noexcept {
            ++s;
        });
        return s;
    }